

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O2

st__table * st__copy(st__table *old_table)

{
  uint uVar1;
  st__table_entry *psVar2;
  st__compare_func_type p_Var3;
  st__hash_func_type p_Var4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  st__table *__ptr;
  st__table_entry **__ptr_00;
  st__table_entry *psVar9;
  ulong uVar10;
  st__table_entry *psVar11;
  ulong uVar12;
  st__table_entry **ppsVar13;
  uint local_44;
  
  uVar1 = old_table->num_bins;
  __ptr = (st__table *)malloc(0x30);
  if (__ptr != (st__table *)0x0) {
    __ptr->grow_factor = old_table->grow_factor;
    p_Var3 = old_table->compare;
    p_Var4 = old_table->hash;
    iVar6 = old_table->num_entries;
    iVar7 = old_table->max_density;
    iVar8 = old_table->reorder_flag;
    __ptr->num_bins = old_table->num_bins;
    __ptr->num_entries = iVar6;
    __ptr->max_density = iVar7;
    __ptr->reorder_flag = iVar8;
    __ptr->compare = p_Var3;
    __ptr->hash = p_Var4;
    __ptr_00 = (st__table_entry **)malloc((long)(int)uVar1 * 8);
    __ptr->bins = __ptr_00;
    if (__ptr_00 != (st__table_entry **)0x0) {
      uVar10 = 0;
      uVar12 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar12 = uVar10;
      }
      local_44 = 1;
      do {
        if (uVar10 == uVar12) {
          return __ptr;
        }
        __ptr_00[uVar10] = (st__table_entry *)0x0;
        ppsVar13 = old_table->bins + uVar10;
        psVar11 = (st__table_entry *)0x0;
LAB_00380772:
        psVar2 = *ppsVar13;
        if (psVar2 != (st__table_entry *)0x0) {
          psVar9 = (st__table_entry *)malloc(0x18);
          if (psVar9 != (st__table_entry *)0x0) goto code_r0x00380788;
          for (uVar12 = 0; uVar12 != local_44; uVar12 = uVar12 + 1) {
            psVar11 = __ptr_00[uVar12];
            while (psVar11 != (st__table_entry *)0x0) {
              psVar2 = psVar11->next;
              free(psVar11);
              psVar11 = psVar2;
            }
          }
          free(__ptr_00);
          break;
        }
        uVar10 = uVar10 + 1;
        local_44 = local_44 + 1;
      } while( true );
    }
    free(__ptr);
  }
  return (st__table *)0x0;
code_r0x00380788:
  pcVar5 = psVar2->record;
  psVar9->key = psVar2->key;
  psVar9->record = pcVar5;
  psVar9->next = psVar11;
  __ptr_00[uVar10] = psVar9;
  ppsVar13 = &psVar2->next;
  psVar11 = psVar9;
  goto LAB_00380772;
}

Assistant:

st__table *
 st__copy( st__table *old_table)
{
    st__table *newEntry_table;
    st__table_entry *ptr, *newEntryptr, *next, *newEntry;
    int i, j, num_bins = old_table->num_bins;

    newEntry_table = ABC_ALLOC( st__table, 1);
    if (newEntry_table == NULL) {
    return NULL;
    }
    
    *newEntry_table = *old_table;
    newEntry_table->bins = ABC_ALLOC( st__table_entry *, num_bins);
    if (newEntry_table->bins == NULL) {
    ABC_FREE(newEntry_table);
    return NULL;
    }
    for(i = 0; i < num_bins ; i++) {
    newEntry_table->bins[i] = NULL;
    ptr = old_table->bins[i];
    while (ptr != NULL) {
        newEntry = ABC_ALLOC( st__table_entry, 1);
        if (newEntry == NULL) {
        for (j = 0; j <= i; j++) {
            newEntryptr = newEntry_table->bins[j];
            while (newEntryptr != NULL) {
            next = newEntryptr->next;
            ABC_FREE(newEntryptr);
            newEntryptr = next;
            }
        }
        ABC_FREE(newEntry_table->bins);
        ABC_FREE(newEntry_table);
        return NULL;
        }
        *newEntry = *ptr;
        newEntry->next = newEntry_table->bins[i];
        newEntry_table->bins[i] = newEntry;
        ptr = ptr->next;
    }
    }
    return newEntry_table;
}